

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O1

VP8StatusCode
WebPAllocateDecBuffer(int width,int height,WebPDecoderOptions *options,WebPDecBuffer *buffer)

{
  uint h;
  VP8StatusCode VVar1;
  bool bVar2;
  int iVar3;
  VP8StatusCode VVar4;
  uint8_t *puVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  int scaled_height;
  int scaled_width;
  uint local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  if (height < 1) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (width < 1) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (buffer == (WebPDecBuffer *)0x0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (options != (WebPDecoderOptions *)0x0) {
    if (options->use_cropping != 0) {
      uVar7 = options->crop_width;
      h = options->crop_height;
      iVar3 = WebPCheckCropDimensions
                        (width,height,options->crop_left & 0xfffffffe,options->crop_top & 0xfffffffe
                         ,uVar7,h);
      width = uVar7;
      height = h;
      if (iVar3 == 0) {
        return VP8_STATUS_INVALID_PARAM;
      }
    }
    if (options->use_scaling != 0) {
      local_44 = options->scaled_width;
      local_48 = options->scaled_height;
      iVar3 = WebPRescalerGetScaledDimensions(width,height,(int *)&local_44,(int *)&local_48);
      width = local_44;
      height = local_48;
      if (iVar3 == 0) {
        return VP8_STATUS_INVALID_PARAM;
      }
    }
  }
  buffer->width = width;
  buffer->height = height;
  VVar1 = buffer->colorspace;
  VVar4 = VP8_STATUS_INVALID_PARAM;
  if (0xc < VVar1 || (height < 1 || width < 1)) goto LAB_001388c7;
  if ((buffer->is_external_memory < 1) && (buffer->private_memory == (uint8_t *)0x0)) {
    if ((ulong)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[VVar1] * (ulong)(uint)width <
        0x80000000) {
      uVar7 = (uint)"\x03\x04\x03\x04\x04\x02\x02\x04\x04\x04\x02\x01\x01"[VVar1] * width;
      sVar6 = (ulong)uVar7 * (ulong)(uint)height;
      if (VVar1 < 0xb) {
        local_38 = 0;
        uVar8 = 0;
        sVar9 = 0;
        local_40 = 0;
      }
      else {
        local_40 = (ulong)(width + 1U >> 1);
        sVar9 = (height + 1U >> 1) * local_40;
        local_38 = 0;
        uVar8 = (ulong)(uint)width * (ulong)(uint)height;
        if (VVar1 != 0xc) {
          uVar8 = local_38;
        }
        if ((ulong)VVar1 == 0xc) {
          local_38 = (ulong)(uint)width;
        }
      }
      puVar5 = (uint8_t *)WebPSafeMalloc(sVar6 + uVar8 + sVar9 * 2,1);
      if (puVar5 == (uint8_t *)0x0) {
        VVar4 = VP8_STATUS_OUT_OF_MEMORY;
        goto LAB_001388b4;
      }
      buffer->private_memory = puVar5;
      (buffer->u).RGBA.rgba = puVar5;
      VVar4 = VVar1;
      if (VVar1 < 0xb) {
        (buffer->u).RGBA.stride = uVar7;
        (buffer->u).RGBA.size = sVar6;
        bVar2 = true;
      }
      else {
        (buffer->u).YUVA.y_stride = uVar7;
        (buffer->u).YUVA.y_size = sVar6;
        puVar5 = puVar5 + sVar6;
        (buffer->u).YUVA.u = puVar5;
        (buffer->u).YUVA.u_stride = (int)local_40;
        (buffer->u).YUVA.u_size = sVar9;
        (buffer->u).YUVA.v = puVar5 + sVar9;
        (buffer->u).YUVA.v_stride = (int)local_40;
        (buffer->u).YUVA.v_size = sVar9;
        if (VVar1 == 0xc) {
          (buffer->u).YUVA.a = puVar5 + sVar9 * 2;
        }
        (buffer->u).YUVA.a_size = uVar8;
        (buffer->u).YUVA.a_stride = (int)local_38;
        bVar2 = true;
      }
    }
    else {
      VVar4 = VP8_STATUS_INVALID_PARAM;
LAB_001388b4:
      bVar2 = false;
    }
    if (!bVar2) goto LAB_001388c7;
  }
  VVar4 = CheckDecBuffer(buffer);
LAB_001388c7:
  if (VVar4 == VP8_STATUS_OK && options != (WebPDecoderOptions *)0x0) {
    if (options->flip == 0) {
      VVar4 = VP8_STATUS_OK;
    }
    else {
      VVar4 = WebPFlipBuffer(buffer);
    }
  }
  return VVar4;
}

Assistant:

VP8StatusCode WebPAllocateDecBuffer(int width, int height,
                                    const WebPDecoderOptions* const options,
                                    WebPDecBuffer* const buffer) {
  VP8StatusCode status;
  if (buffer == NULL || width <= 0 || height <= 0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (options != NULL) {    // First, apply options if there is any.
    if (options->use_cropping) {
      const int cw = options->crop_width;
      const int ch = options->crop_height;
      const int x = options->crop_left & ~1;
      const int y = options->crop_top & ~1;
      if (!WebPCheckCropDimensions(width, height, x, y, cw, ch)) {
        return VP8_STATUS_INVALID_PARAM;   // out of frame boundary.
      }
      width = cw;
      height = ch;
    }

    if (options->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
      int scaled_width = options->scaled_width;
      int scaled_height = options->scaled_height;
      if (!WebPRescalerGetScaledDimensions(
              width, height, &scaled_width, &scaled_height)) {
        return VP8_STATUS_INVALID_PARAM;
      }
      width = scaled_width;
      height = scaled_height;
#else
      return VP8_STATUS_INVALID_PARAM;   // rescaling not supported
#endif
    }
  }
  buffer->width = width;
  buffer->height = height;

  // Then, allocate buffer for real.
  status = AllocateBuffer(buffer);
  if (status != VP8_STATUS_OK) return status;

  // Use the stride trick if vertical flip is needed.
  if (options != NULL && options->flip) {
    status = WebPFlipBuffer(buffer);
  }
  return status;
}